

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_set_frame_size(AV1_COMP *cpi,int width,int height)

{
  AV1_COMMON *cm_00;
  CommonContexts *above_contexts;
  uint8_t uVar1;
  byte bVar2;
  aom_enc_pass aVar3;
  SequenceHeader *pSVar4;
  aom_codec_err_t error;
  int iVar5;
  uint num_planes;
  MB_MODE_INFO_EXT_FRAME *pMVar6;
  MV_REF *pMVar7;
  uint8_t *puVar8;
  TPL_MV_REF *pTVar9;
  long lVar10;
  long lVar11;
  scale_factors *psVar12;
  int iVar13;
  RefCntBuffer *pRVar14;
  _Bool _Var15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  AV1_COMMON *cm;
  
  pSVar4 = (cpi->common).seq_params;
  uVar1 = pSVar4->monochrome;
  cm_00 = &cpi->common;
  if (((cpi->common).width != width) || ((cpi->common).height != height)) {
    error = av1_check_initial_width
                      (cpi,(uint)pSVar4->use_highbitdepth,pSVar4->subsampling_x,
                       pSVar4->subsampling_y);
    if (error != AOM_CODEC_OK) {
      aom_internal_error((cpi->common).error,error,"av1_check_initial_width() failed");
    }
    if (0 < height && 0 < width) {
      (cpi->common).width = width;
      (cpi->common).height = height;
      if ((cpi->data_alloc_width < width) || (cpi->data_alloc_height < height)) {
        av1_free_context_buffers(cm_00);
        av1_free_shared_coeff_buffer(&(cpi->td).shared_coeff_buf);
        av1_free_sms_tree(&cpi->td);
        av1_free_pmc((cpi->td).firstpass_ctx,
                     (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
        (cpi->td).firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
        alloc_compressor_data(cpi);
        realloc_segmentation_maps(cpi);
        iVar5 = (cpi->common).height;
        cpi->data_alloc_width = (cpi->common).width;
        cpi->data_alloc_height = iVar5;
        cpi->frame_size_related_setup_done = false;
      }
      iVar5 = av1_alloc_context_buffers
                        (cm_00,(cpi->common).width,(cpi->common).height,
                         (cpi->sf).part_sf.default_min_partition_size);
      if (iVar5 != 0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate context buffers");
      }
      if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [(cpi->common).mi_params.mi_alloc_bsize];
        iVar5 = (int)((bVar2 - 1) + (cpi->common).mi_params.mi_cols) / (int)(uint)bVar2;
        iVar13 = ((int)((cpi->common).mi_params.mi_rows + (bVar2 - 1)) / (int)(uint)bVar2) * iVar5;
        if ((cpi->mbmi_ext_info).alloc_size < iVar13) {
          aom_free((cpi->mbmi_ext_info).frame_base);
          (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
          (cpi->mbmi_ext_info).alloc_size = 0;
          pMVar6 = (MB_MODE_INFO_EXT_FRAME *)aom_malloc((long)iVar13 * 0x54);
          (cpi->mbmi_ext_info).frame_base = pMVar6;
          if (pMVar6 == (MB_MODE_INFO_EXT_FRAME *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate mbmi_ext_info->frame_base");
          }
          (cpi->mbmi_ext_info).alloc_size = iVar13;
        }
        (cpi->mbmi_ext_info).stride = iVar5;
      }
      av1_update_frame_size(cpi);
    }
    if ((cpi->common).features.coded_lossless == true) {
      _Var15 = (cpi->common).width == (cpi->common).superres_upscaled_width;
    }
    else {
      _Var15 = false;
    }
    (cpi->common).features.all_lossless = _Var15;
    av1_noise_estimate_init(&cpi->noise_estimate,(cpi->common).width,(cpi->common).height);
  }
  aVar3 = (cpi->oxcf).pass;
  if ((AOM_RC_FIRST_PASS < aVar3) ||
     (((aVar3 == AOM_RC_ONE_PASS && (cpi->compressor_stage == '\0')) && (cpi->ppi->lap_enabled != 0)
      ))) {
    av1_set_target_rate(cpi,(cpi->common).width,(cpi->common).height);
  }
  pRVar14 = (cpi->common).cur_frame;
  if (((pRVar14->mvs == (MV_REF *)0x0) || (pRVar14->mi_rows != (cpi->common).mi_params.mi_rows)) ||
     (pRVar14->mi_cols != (cpi->common).mi_params.mi_cols)) {
    aom_free(pRVar14->mvs);
    iVar5 = (cpi->common).mi_params.mi_rows;
    pRVar14->mi_rows = iVar5;
    iVar13 = (cpi->common).mi_params.mi_cols;
    pRVar14->mi_cols = iVar13;
    pMVar7 = (MV_REF *)aom_calloc((long)((iVar13 + 1 >> 1) * (iVar5 + 1 >> 1)),8);
    pRVar14->mvs = pMVar7;
    if (pMVar7 == (MV_REF *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate buf->mvs");
    }
    aom_free(pRVar14->seg_map);
    puVar8 = (uint8_t *)
             aom_calloc((long)(cpi->common).mi_params.mi_cols *
                        (long)(cpi->common).mi_params.mi_rows,1);
    pRVar14->seg_map = puVar8;
    if (puVar8 == (uint8_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate buf->seg_map");
    }
  }
  iVar5 = ((cpi->common).mi_params.mi_stride >> 1) * ((cpi->common).mi_params.mi_rows + 0x20 >> 1);
  pTVar9 = (cpi->common).tpl_mvs;
  if ((pTVar9 == (TPL_MV_REF *)0x0) || ((cpi->common).tpl_mvs_mem_size < iVar5)) {
    aom_free(pTVar9);
    pTVar9 = (TPL_MV_REF *)aom_calloc((long)iVar5,8);
    (cpi->common).tpl_mvs = pTVar9;
    if (pTVar9 == (TPL_MV_REF *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->tpl_mvs");
    }
    (cpi->common).tpl_mvs_mem_size = iVar5;
  }
  iVar5 = (cpi->common).height;
  pRVar14->width = (cpi->common).width;
  pRVar14->height = iVar5;
  if ((((cpi->common).above_contexts.num_planes <
        (int)((uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1)) ||
      ((cpi->common).above_contexts.num_mi_cols < (cpi->common).mi_params.mi_cols)) ||
     ((cpi->common).above_contexts.num_tile_rows < (cpi->common).tiles.rows)) {
    above_contexts = &(cpi->common).above_contexts;
    av1_free_above_context_buffers(above_contexts);
    iVar5 = av1_alloc_above_context_buffers
                      (above_contexts,(cpi->common).tiles.rows,(cpi->common).mi_params.mi_cols,
                       (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    if (iVar5 != 0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate context buffers");
    }
  }
  bVar16 = true;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
    bVar16 = (cpi->oxcf).superres_cfg.superres_mode != AOM_SUPERRES_NONE;
  }
  iVar5 = 0x40;
  if (bVar16) {
    iVar5 = 0x120;
  }
  else if ((cpi->oxcf).kf_cfg.key_freq_max != 0) {
    iVar5 = block_size_wide[((cpi->common).seq_params)->sb_size] + 0x20;
  }
  (cpi->oxcf).border_in_pixels = iVar5;
  iVar5 = aom_realloc_frame_buffer
                    (&((cpi->common).cur_frame)->buf,(cpi->common).width,(cpi->common).height,
                     pSVar4->subsampling_x,pSVar4->subsampling_y,(uint)pSVar4->use_highbitdepth,
                     iVar5,(cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                     (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,cpi->alloc_pyramid,0);
  if (iVar5 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer");
  }
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    av1_init_cdef_worker(cpi);
  }
  num_planes = (uint)(uVar1 == '\0') * 2 + 1;
  if (((((cpi->common).seq_params)->enable_restoration != '\0') &&
      ((cpi->common).features.all_lossless == false)) && ((cpi->common).tiles.large_scale == 0)) {
    lVar10 = (ulong)num_planes - 1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
    auVar18 = auVar18 ^ _DAT_004d0530;
    if (auVar18._12_4_ != -0x80000000 || -0x80000000 < auVar18._8_4_) {
      (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
    }
    if (auVar18._4_4_ != -0x80000000 || -0x7fffffff < auVar18._0_4_) {
      (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
    }
    if (auVar18._12_4_ != -0x80000000 || -0x7ffffffe < auVar18._8_4_) {
      *(undefined4 *)&(cpi->common).rst_tmpbuf = 0;
    }
    av1_alloc_restoration_buffers(cm_00,(_Bool)((cpi->sf).lpf_sf.disable_sgr_filter ^ 1));
    if (1 < (cpi->ppi->p_mt_info).num_workers) {
      av1_init_lr_mt_buffers(cpi);
    }
  }
  init_motion_estimation(cpi);
  bVar16 = false;
  lVar10 = 0xf01c;
  do {
    lVar11 = (long)*(int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar10 * 4
                           );
    if (lVar11 == -1) {
      pRVar14 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar14 = (cpi->common).ref_frame_map[lVar11];
    }
    if (pRVar14 != (RefCntBuffer *)0x0) {
      lVar11 = (long)*(int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                             lVar10 * 4);
      bVar17 = false;
      psVar12 = (scale_factors *)0x0;
      if (lVar11 != -1) {
        psVar12 = (cpi->common).ref_scale_factors + lVar11;
      }
      av1_setup_scale_factors_for_frame
                (psVar12,(pRVar14->buf).field_2.field_0.y_crop_width,
                 (pRVar14->buf).field_3.field_0.y_crop_height,(cpi->common).width,
                 (cpi->common).height);
      iVar5 = psVar12->x_scale_fp;
      if (iVar5 != -1) {
        bVar17 = psVar12->y_scale_fp != -1;
      }
      bVar16 = (bool)(bVar16 | bVar17);
      if (((iVar5 != -1) && (psVar12->y_scale_fp != -1)) &&
         (psVar12->y_scale_fp != 0x4000 || iVar5 != 0x4000)) {
        aom_extend_frame_borders_c(&pRVar14->buf,num_planes);
      }
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0xf023);
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     (((cpi->oxcf).rc_cfg.mode == AOM_CBR && (0 < (cpi->svc).spatial_layer_id)))) {
    bVar17 = (cpi->oxcf).rc_cfg.target_bandwidth == 0;
  }
  else {
    bVar17 = false;
  }
  if (((((cm_00->current_frame).frame_type & 0xfd) != 0) && (!bVar16)) && (!bVar17)) {
    aom_internal_error((cpi->common).error,AOM_CODEC_CORRUPT_FRAME,
                       "Can\'t find at least one reference frame with valid size");
  }
  iVar5 = (cpi->common).width;
  iVar13 = (cpi->common).height;
  av1_setup_scale_factors_for_frame(&(cpi->common).sf_identity,iVar5,iVar13,iVar5,iVar13);
  lVar10 = (long)(cpi->common).remapped_ref_idx[0];
  psVar12 = (scale_factors *)0x0;
  if (lVar10 != -1) {
    psVar12 = (cpi->common).ref_scale_factors + lVar10;
  }
  (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = psVar12;
  (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = psVar12;
  return;
}

Assistant:

void av1_set_frame_size(AV1_COMP *cpi, int width, int height) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  int ref_frame;

  if (width != cm->width || height != cm->height) {
    // There has been a change in the encoded frame size
    set_size_literal(cpi, width, height);
    // Recalculate 'all_lossless' in case super-resolution was (un)selected.
    cm->features.all_lossless =
        cm->features.coded_lossless && !av1_superres_scaled(cm);

    av1_noise_estimate_init(&cpi->noise_estimate, cm->width, cm->height);
#if CONFIG_AV1_TEMPORAL_DENOISING
    // Reset the denoiser on the resized frame.
    if (cpi->oxcf.noise_sensitivity > 0) {
      av1_denoiser_free(&(cpi->denoiser));
      setup_denoiser_buffer(cpi);
    }
#endif
  }
  if (is_stat_consumption_stage(cpi)) {
    av1_set_target_rate(cpi, cm->width, cm->height);
  }

  alloc_frame_mvs(cm, cm->cur_frame);

  // Allocate above context buffers
  CommonContexts *const above_contexts = &cm->above_contexts;
  if (above_contexts->num_planes < av1_num_planes(cm) ||
      above_contexts->num_mi_cols < cm->mi_params.mi_cols ||
      above_contexts->num_tile_rows < cm->tiles.rows) {
    av1_free_above_context_buffers(above_contexts);
    if (av1_alloc_above_context_buffers(above_contexts, cm->tiles.rows,
                                        cm->mi_params.mi_cols,
                                        av1_num_planes(cm)))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate context buffers");
  }

  AV1EncoderConfig *oxcf = &cpi->oxcf;
  oxcf->border_in_pixels = av1_get_enc_border_size(
      av1_is_resize_needed(oxcf), oxcf->kf_cfg.key_freq_max == 0,
      cm->seq_params->sb_size);

  // Reset the frame pointers to the current frame size.
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");

  if (!is_stat_generation_stage(cpi)) av1_init_cdef_worker(cpi);

#if !CONFIG_REALTIME_ONLY
  if (is_restoration_used(cm)) {
    for (int i = 0; i < num_planes; ++i)
      cm->rst_info[i].frame_restoration_type = RESTORE_NONE;

    const bool is_sgr_enabled = !cpi->sf.lpf_sf.disable_sgr_filter;
    av1_alloc_restoration_buffers(cm, is_sgr_enabled);
    // Store the allocated restoration buffers in MT object.
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      av1_init_lr_mt_buffers(cpi);
    }
  }
#endif

  init_motion_estimation(cpi);

  int has_valid_ref_frame = 0;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
      av1_setup_scale_factors_for_frame(sf, buf->buf.y_crop_width,
                                        buf->buf.y_crop_height, cm->width,
                                        cm->height);
      has_valid_ref_frame |= av1_is_valid_scale(sf);
      if (av1_is_scaled(sf)) aom_extend_frame_borders(&buf->buf, num_planes);
    }
  }
  // For 1 pass CBR mode: we can skip this check for spatial enhancement
  // layer if the target_bandwidth is zero, since it will be dropped.
  const bool dropped_frame =
      has_no_stats_stage(cpi) && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cpi->svc.spatial_layer_id > 0 && cpi->oxcf.rc_cfg.target_bandwidth == 0;
  if (!frame_is_intra_only(cm) && !has_valid_ref_frame && !dropped_frame) {
    aom_internal_error(
        cm->error, AOM_CODEC_CORRUPT_FRAME,
        "Can't find at least one reference frame with valid size");
  }

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  set_ref_ptrs(cm, xd, LAST_FRAME, LAST_FRAME);
}